

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-read.c
# Opt level: O2

size_t hd_skip(hd_context *ctx,hd_stream *stm,size_t len)

{
  size_t sVar1;
  size_t sVar2;
  ulong len_00;
  
  sVar2 = 0;
  do {
    if (len == 0) {
      return sVar2;
    }
    len_00 = 0x1000;
    if (len < 0x1000) {
      len_00 = len;
    }
    sVar1 = hd_read(ctx,stm,skip_buf,len_00);
    sVar2 = sVar2 + sVar1;
    len = len - sVar1;
  } while (len_00 <= sVar1);
  return sVar2;
}

Assistant:

size_t hd_skip(hd_context *ctx, hd_stream *stm, size_t len)
{
    size_t count, l, total = 0;

    while (len)
    {
        l = len;
        if (l > sizeof(skip_buf))
            l = sizeof(skip_buf);
        count = hd_read(ctx, stm, skip_buf, l);
        total += count;
        if (count < l)
            break;
        len -= count;
    }
    return total;
}